

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::ObjectIntersectorK<8,_false>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ulong uVar16;
  _func_int **pp_Var17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  NodeRef nodeRef;
  ulong *puVar22;
  undefined1 (*pauVar23) [32];
  ulong uVar24;
  bool bVar25;
  byte bVar26;
  ushort uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  vint<8> mask;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  RTCIntersectFunctionNArguments local_5988;
  Geometry *local_5958;
  undefined8 local_5950;
  RTCIntersectArguments *local_5948;
  undefined1 local_5940 [32];
  undefined1 local_5920 [32];
  undefined1 local_5900 [32];
  undefined1 local_58e0 [32];
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 uStack_5810;
  ulong local_5808 [561];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  undefined1 auVar35 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar31 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
      uVar24 = vpcmpeqd_avx512vl(auVar31,(undefined1  [32])valid_i->field_0);
      bVar26 = (byte)uVar24;
      if (bVar26 != 0) {
        auVar31 = *(undefined1 (*) [32])(ray + 0x80);
        auVar30 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar34 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar33._8_4_ = 0x7fffffff;
        auVar33._0_8_ = 0x7fffffff7fffffff;
        auVar33._12_4_ = 0x7fffffff;
        auVar33._16_4_ = 0x7fffffff;
        auVar33._20_4_ = 0x7fffffff;
        auVar33._24_4_ = 0x7fffffff;
        auVar33._28_4_ = 0x7fffffff;
        auVar29 = vandps_avx(auVar34,auVar33);
        auVar39._8_4_ = 0x219392ef;
        auVar39._0_8_ = 0x219392ef219392ef;
        auVar39._12_4_ = 0x219392ef;
        auVar39._16_4_ = 0x219392ef;
        auVar39._20_4_ = 0x219392ef;
        auVar39._24_4_ = 0x219392ef;
        auVar39._28_4_ = 0x219392ef;
        uVar19 = vcmpps_avx512vl(auVar29,auVar39,1);
        bVar5 = (bool)((byte)uVar19 & 1);
        auVar29._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._0_4_;
        bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar29._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._4_4_;
        bVar5 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar29._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._8_4_;
        bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar29._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._12_4_;
        bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar29._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._16_4_;
        bVar5 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar29._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._20_4_;
        bVar5 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar29._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._24_4_;
        bVar5 = SUB81(uVar19 >> 7,0);
        auVar29._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar34._28_4_;
        auVar28 = vrcp14ps_avx512vl(auVar29);
        auVar42._8_4_ = 0x3f800000;
        auVar42._0_8_ = &DAT_3f8000003f800000;
        auVar42._12_4_ = 0x3f800000;
        auVar42._16_4_ = 0x3f800000;
        auVar42._20_4_ = 0x3f800000;
        auVar42._24_4_ = 0x3f800000;
        auVar42._28_4_ = 0x3f800000;
        auVar13 = vfnmadd213ps_fma(auVar29,auVar28,auVar42);
        auVar34 = vandps_avx(auVar30,auVar33);
        uVar19 = vcmpps_avx512vl(auVar34,auVar39,1);
        bVar5 = (bool)((byte)uVar19 & 1);
        auVar34._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._0_4_;
        bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar34._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._4_4_;
        bVar5 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar34._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._8_4_;
        bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar34._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._12_4_;
        bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar34._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._16_4_;
        bVar5 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar34._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._20_4_;
        bVar5 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar34._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._24_4_;
        bVar5 = SUB81(uVar19 >> 7,0);
        auVar34._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar30._28_4_;
        auVar29 = vrcp14ps_avx512vl(auVar34);
        auVar14 = vfnmadd213ps_fma(auVar34,auVar29,auVar42);
        auVar30 = vandps_avx(auVar31,auVar33);
        uVar19 = vcmpps_avx512vl(auVar30,auVar39,1);
        bVar5 = (bool)((byte)uVar19 & 1);
        auVar30._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._0_4_;
        bVar5 = (bool)((byte)(uVar19 >> 1) & 1);
        auVar30._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._4_4_;
        bVar5 = (bool)((byte)(uVar19 >> 2) & 1);
        auVar30._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._8_4_;
        bVar5 = (bool)((byte)(uVar19 >> 3) & 1);
        auVar30._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._12_4_;
        bVar5 = (bool)((byte)(uVar19 >> 4) & 1);
        auVar30._16_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._16_4_;
        bVar5 = (bool)((byte)(uVar19 >> 5) & 1);
        auVar30._20_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._20_4_;
        bVar5 = (bool)((byte)(uVar19 >> 6) & 1);
        auVar30._24_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._24_4_;
        bVar5 = SUB81(uVar19 >> 7,0);
        auVar30._28_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar31._28_4_;
        auVar31 = vrcp14ps_avx512vl(auVar30);
        auVar15 = vfnmadd213ps_fma(auVar30,auVar31,auVar42);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar31,auVar31);
        auVar45 = ZEXT1664(auVar15);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar29,auVar29);
        auVar46 = ZEXT1664(auVar14);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar28,auVar28);
        auVar47 = ZEXT1664(auVar13);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar48 = ZEXT3264(local_4680);
        auVar31 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
        local_4660._0_4_ =
             (uint)(bVar26 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar26 & 1) * 0x7f800000;
        bVar5 = (bool)((byte)(uVar24 >> 1) & 1);
        local_4660._4_4_ = (uint)bVar5 * auVar31._4_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar24 >> 2) & 1);
        local_4660._8_4_ = (uint)bVar5 * auVar31._8_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar24 >> 3) & 1);
        local_4660._12_4_ = (uint)bVar5 * auVar31._12_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar24 >> 4) & 1);
        local_4660._16_4_ = (uint)bVar5 * auVar31._16_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar24 >> 5) & 1);
        local_4660._20_4_ = (uint)bVar5 * auVar31._20_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = (bool)((byte)(uVar24 >> 6) & 1);
        local_4660._24_4_ = (uint)bVar5 * auVar31._24_4_ | (uint)!bVar5 * 0x7f800000;
        bVar5 = SUB81(uVar24 >> 7,0);
        local_4660._28_4_ = (uint)bVar5 * auVar31._28_4_ | (uint)!bVar5 * 0x7f800000;
        auVar49 = ZEXT3264(local_4660);
        auVar31 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40));
        bVar5 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar25 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar10 = SUB81(uVar24 >> 7,0);
        auVar50 = ZEXT3264(CONCAT428((uint)bVar10 * auVar31._28_4_ | (uint)!bVar10 * -0x800000,
                                     CONCAT424((uint)bVar9 * auVar31._24_4_ |
                                               (uint)!bVar9 * -0x800000,
                                               CONCAT420((uint)bVar8 * auVar31._20_4_ |
                                                         (uint)!bVar8 * -0x800000,
                                                         CONCAT416((uint)bVar7 * auVar31._16_4_ |
                                                                   (uint)!bVar7 * -0x800000,
                                                                   CONCAT412((uint)bVar6 *
                                                                             auVar31._12_4_ |
                                                                             (uint)!bVar6 *
                                                                             -0x800000,
                                                                             CONCAT48((uint)bVar25 *
                                                                                      auVar31._8_4_
                                                                                      | (uint)!
                                                  bVar25 * -0x800000,
                                                  CONCAT44((uint)bVar5 * auVar31._4_4_ |
                                                           (uint)!bVar5 * -0x800000,
                                                           (uint)(bVar26 & 1) * auVar31._0_4_ |
                                                           (uint)!(bool)(bVar26 & 1) * -0x800000))))
                                                  ))));
        puVar22 = local_5808 + 1;
        pauVar23 = (undefined1 (*) [32])local_4640;
        auVar51._0_4_ = auVar15._0_4_ * -*(float *)ray;
        auVar51._4_4_ = auVar15._4_4_ * -*(float *)(ray + 4);
        auVar51._8_4_ = auVar15._8_4_ * -*(float *)(ray + 8);
        auVar51._12_4_ = auVar15._12_4_ * -*(float *)(ray + 0xc);
        auVar51._16_4_ = -*(float *)(ray + 0x10) * 0.0;
        auVar51._20_4_ = -*(float *)(ray + 0x14) * 0.0;
        auVar51._28_36_ = in_ZMM15._28_36_;
        auVar51._24_4_ = -*(float *)(ray + 0x18) * 0.0;
        auVar51 = ZEXT3264(auVar51._0_32_);
        auVar31 = *(undefined1 (*) [32])(ray + 0x20);
        auVar32._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
        auVar32._8_4_ = auVar31._8_4_ ^ 0x80000000;
        auVar32._12_4_ = auVar31._12_4_ ^ 0x80000000;
        auVar32._16_4_ = auVar31._16_4_ ^ 0x80000000;
        auVar32._20_4_ = auVar31._20_4_ ^ 0x80000000;
        auVar32._24_4_ = auVar31._24_4_ ^ 0x80000000;
        auVar32._28_4_ = auVar31._28_4_ ^ 0x80000000;
        auVar31 = *(undefined1 (*) [32])(ray + 0x40);
        auVar28._0_8_ = auVar31._0_8_ ^ 0x8000000080000000;
        auVar28._8_4_ = auVar31._8_4_ ^ 0x80000000;
        auVar28._12_4_ = auVar31._12_4_ ^ 0x80000000;
        auVar28._16_4_ = auVar31._16_4_ ^ 0x80000000;
        auVar28._20_4_ = auVar31._20_4_ ^ 0x80000000;
        auVar28._24_4_ = auVar31._24_4_ ^ 0x80000000;
        auVar28._28_4_ = auVar31._28_4_ ^ 0x80000000;
        auVar31 = vmulps_avx512vl(ZEXT1632(auVar14),auVar32);
        auVar52 = ZEXT3264(auVar31);
        auVar31 = vmulps_avx512vl(ZEXT1632(auVar13),auVar28);
        auVar53 = ZEXT3264(auVar31);
        uStack_5810 = 0xfffffffffffffff8;
        local_5808[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
        do {
          auVar31 = auVar50._0_32_;
          pauVar23 = pauVar23 + -1;
          puVar1 = puVar22 + -1;
          puVar22 = puVar22 + -1;
          bVar5 = true;
          if (*puVar1 != 0xfffffffffffffff8) {
            auVar36 = ZEXT3264(*pauVar23);
            uVar12 = vcmpps_avx512vl(*pauVar23,auVar31,1);
            uVar24 = *puVar1;
            if ((char)uVar12 != '\0') {
              do {
                local_5860 = auVar45._0_32_;
                local_5900 = auVar51._0_32_;
                local_5880 = auVar46._0_32_;
                local_5920 = auVar52._0_32_;
                local_58a0 = auVar47._0_32_;
                local_5940 = auVar53._0_32_;
                local_58c0 = auVar49._0_32_;
                if ((uVar24 & 8) != 0) {
                  if (uVar24 == 0xfffffffffffffff8) goto LAB_008870de;
                  uVar19 = vcmpps_avx512vl(auVar31,auVar36._0_32_,6);
                  uVar27 = (ushort)uVar19;
                  if ((byte)uVar19 != 0) {
                    uVar16 = (ulong)((uint)uVar24 & 0xf);
                    if (uVar16 != 8) {
                      lVar18 = 0;
                      local_58e0 = auVar31;
                      do {
                        local_5988.geomID = *(uint *)((uVar24 & 0xfffffffffffffff0) + lVar18 * 8);
                        local_5958 = (context->scene->geometries).items[local_5988.geomID].ptr;
                        uVar3 = local_5958->mask;
                        auVar31._4_4_ = uVar3;
                        auVar31._0_4_ = uVar3;
                        auVar31._8_4_ = uVar3;
                        auVar31._12_4_ = uVar3;
                        auVar31._16_4_ = uVar3;
                        auVar31._20_4_ = uVar3;
                        auVar31._24_4_ = uVar3;
                        auVar31._28_4_ = uVar3;
                        uVar21 = vptestmd_avx512vl(auVar31,*(undefined1 (*) [32])(ray + 0x120));
                        uVar21 = uVar19 & 0xff & uVar21;
                        if ((char)uVar21 != '\0') {
                          local_5988.primID =
                               *(uint *)((uVar24 & 0xfffffffffffffff0) + 4 + lVar18 * 8);
                          local_5840 = vpmovm2d_avx512vl(uVar21);
                          local_5988.valid = (int *)local_5840;
                          local_5988.geometryUserPtr = local_5958->userPtr;
                          local_5988.context = context->user;
                          local_5988.N = 8;
                          local_5950 = 0;
                          local_5948 = context->args;
                          pp_Var17 = (_func_int **)local_5948->intersect;
                          if (pp_Var17 == (_func_int **)0x0) {
                            pp_Var17 = local_5958[1].super_RefCount._vptr_RefCount;
                          }
                          local_5988.rayhit = (RTCRayHitN *)ray;
                          (*(code *)pp_Var17)(&local_5988);
                          auVar45 = ZEXT3264(local_5860);
                          auVar46 = ZEXT3264(local_5880);
                          auVar47 = ZEXT3264(local_58a0);
                          auVar48 = ZEXT3264(CONCAT428(0x7f800000,
                                                       CONCAT424(0x7f800000,
                                                                 CONCAT420(0x7f800000,
                                                                           CONCAT416(0x7f800000,
                                                                                     CONCAT412(
                                                  0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)
                                                  ))))));
                          auVar49 = ZEXT3264(local_58c0);
                          auVar50 = ZEXT3264(local_58e0);
                          auVar51 = ZEXT3264(local_5900);
                          auVar52 = ZEXT3264(local_5920);
                          auVar53 = ZEXT3264(local_5940);
                        }
                        auVar31 = auVar50._0_32_;
                        lVar18 = lVar18 + 1;
                      } while (uVar16 - 8 != lVar18);
                    }
                    bVar5 = (bool)((byte)uVar19 & 1);
                    bVar25 = (bool)((byte)(uVar27 >> 1) & 1);
                    bVar6 = (bool)((byte)(uVar27 >> 2) & 1);
                    bVar7 = (bool)((byte)(uVar27 >> 3) & 1);
                    bVar8 = (bool)((byte)(uVar27 >> 4) & 1);
                    bVar9 = (bool)((byte)(uVar27 >> 5) & 1);
                    bVar10 = (bool)((byte)(uVar27 >> 6) & 1);
                    bVar11 = (bool)((byte)(uVar27 >> 7) & 1);
                    auVar50 = ZEXT3264(CONCAT428((uint)bVar11 * *(int *)(ray + 0x11c) |
                                                 (uint)!bVar11 * auVar31._28_4_,
                                                 CONCAT424((uint)bVar10 * *(int *)(ray + 0x118) |
                                                           (uint)!bVar10 * auVar31._24_4_,
                                                           CONCAT420((uint)bVar9 *
                                                                     *(int *)(ray + 0x114) |
                                                                     (uint)!bVar9 * auVar31._20_4_,
                                                                     CONCAT416((uint)bVar8 *
                                                                               *(int *)(ray + 0x110)
                                                                               | (uint)!bVar8 *
                                                                                 auVar31._16_4_,
                                                                               CONCAT412((uint)bVar7
                                                                                         * *(int *)(
                                                  ray + 0x10c) | (uint)!bVar7 * auVar31._12_4_,
                                                  CONCAT48((uint)bVar6 * *(int *)(ray + 0x108) |
                                                           (uint)!bVar6 * auVar31._8_4_,
                                                           CONCAT44((uint)bVar25 *
                                                                    *(int *)(ray + 0x104) |
                                                                    (uint)!bVar25 * auVar31._4_4_,
                                                                    (uint)bVar5 *
                                                                    *(int *)(ray + 0x100) |
                                                                    (uint)!bVar5 * auVar31._0_4_))))
                                                  ))));
                  }
                  break;
                }
                uVar21 = 0;
                auVar36 = ZEXT3264(auVar48._0_32_);
                uVar19 = 0;
                uVar16 = 8;
                do {
                  uVar4 = *(ulong *)((uVar24 & 0xfffffffffffffff0) + uVar19 * 8);
                  if (uVar4 != 8) {
                    uVar2 = *(undefined4 *)(uVar24 + 0x40 + uVar19 * 4);
                    auVar37._4_4_ = uVar2;
                    auVar37._0_4_ = uVar2;
                    auVar37._8_4_ = uVar2;
                    auVar37._12_4_ = uVar2;
                    auVar37._16_4_ = uVar2;
                    auVar37._20_4_ = uVar2;
                    auVar37._24_4_ = uVar2;
                    auVar37._28_4_ = uVar2;
                    auVar15 = vfmadd132ps_fma(auVar37,local_5900,local_5860);
                    uVar2 = *(undefined4 *)(uVar24 + 0x80 + uVar19 * 4);
                    auVar38._4_4_ = uVar2;
                    auVar38._0_4_ = uVar2;
                    auVar38._8_4_ = uVar2;
                    auVar38._12_4_ = uVar2;
                    auVar38._16_4_ = uVar2;
                    auVar38._20_4_ = uVar2;
                    auVar38._24_4_ = uVar2;
                    auVar38._28_4_ = uVar2;
                    auVar29 = vfmadd132ps_avx512vl(auVar38,local_5920,local_5880);
                    uVar2 = *(undefined4 *)(uVar24 + 0xc0 + uVar19 * 4);
                    auVar40._4_4_ = uVar2;
                    auVar40._0_4_ = uVar2;
                    auVar40._8_4_ = uVar2;
                    auVar40._12_4_ = uVar2;
                    auVar40._16_4_ = uVar2;
                    auVar40._20_4_ = uVar2;
                    auVar40._24_4_ = uVar2;
                    auVar40._28_4_ = uVar2;
                    auVar32 = vfmadd132ps_avx512vl(auVar40,local_5940,local_58a0);
                    uVar2 = *(undefined4 *)(uVar24 + 0x60 + uVar19 * 4);
                    auVar41._4_4_ = uVar2;
                    auVar41._0_4_ = uVar2;
                    auVar41._8_4_ = uVar2;
                    auVar41._12_4_ = uVar2;
                    auVar41._16_4_ = uVar2;
                    auVar41._20_4_ = uVar2;
                    auVar41._24_4_ = uVar2;
                    auVar41._28_4_ = uVar2;
                    auVar14 = vfmadd132ps_fma(auVar41,local_5900,local_5860);
                    uVar2 = *(undefined4 *)(uVar24 + 0xa0 + uVar19 * 4);
                    auVar43._4_4_ = uVar2;
                    auVar43._0_4_ = uVar2;
                    auVar43._8_4_ = uVar2;
                    auVar43._12_4_ = uVar2;
                    auVar43._16_4_ = uVar2;
                    auVar43._20_4_ = uVar2;
                    auVar43._24_4_ = uVar2;
                    auVar43._28_4_ = uVar2;
                    auVar28 = vfmadd132ps_avx512vl(auVar43,local_5920,local_5880);
                    uVar2 = *(undefined4 *)(uVar24 + 0xe0 + uVar19 * 4);
                    auVar44._4_4_ = uVar2;
                    auVar44._0_4_ = uVar2;
                    auVar44._8_4_ = uVar2;
                    auVar44._12_4_ = uVar2;
                    auVar44._16_4_ = uVar2;
                    auVar44._20_4_ = uVar2;
                    auVar44._24_4_ = uVar2;
                    auVar44._28_4_ = uVar2;
                    auVar33 = vfmadd132ps_avx512vl(auVar44,local_5940,local_58a0);
                    auVar30 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar14));
                    auVar34 = vpminsd_avx2(auVar29,auVar28);
                    auVar30 = vpmaxsd_avx2(auVar30,auVar34);
                    auVar34 = vpminsd_avx2(auVar32,auVar33);
                    auVar30 = vpmaxsd_avx2(auVar30,auVar34);
                    auVar34 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar14));
                    auVar29 = vpmaxsd_avx2(auVar29,auVar28);
                    auVar28 = vpminsd_avx2(auVar34,auVar29);
                    auVar34 = vpmaxsd_avx2(auVar32,auVar33);
                    auVar29 = vpmaxsd_avx2(auVar30,local_58c0);
                    auVar34 = vpminsd_avx2(auVar34,auVar31);
                    auVar34 = vpminsd_avx2(auVar28,auVar34);
                    uVar20 = vpcmpd_avx512vl(auVar29,auVar34,2);
                    if ((byte)uVar20 != 0) {
                      auVar34 = vblendmps_avx512vl(auVar48._0_32_,auVar30);
                      bVar25 = (bool)((byte)uVar20 & 1);
                      auVar35._0_4_ = (uint)bVar25 * auVar34._0_4_ | (uint)!bVar25 * auVar30._0_4_;
                      bVar25 = (bool)((byte)(uVar20 >> 1) & 1);
                      auVar35._4_4_ = (uint)bVar25 * auVar34._4_4_ | (uint)!bVar25 * auVar30._4_4_;
                      bVar25 = (bool)((byte)(uVar20 >> 2) & 1);
                      auVar35._8_4_ = (uint)bVar25 * auVar34._8_4_ | (uint)!bVar25 * auVar30._8_4_;
                      bVar25 = (bool)((byte)(uVar20 >> 3) & 1);
                      auVar35._12_4_ =
                           (uint)bVar25 * auVar34._12_4_ | (uint)!bVar25 * auVar30._12_4_;
                      bVar25 = (bool)((byte)(uVar20 >> 4) & 1);
                      auVar35._16_4_ =
                           (uint)bVar25 * auVar34._16_4_ | (uint)!bVar25 * auVar30._16_4_;
                      bVar25 = (bool)((byte)(uVar20 >> 5) & 1);
                      auVar35._20_4_ =
                           (uint)bVar25 * auVar34._20_4_ | (uint)!bVar25 * auVar30._20_4_;
                      bVar25 = (bool)((byte)(uVar20 >> 6) & 1);
                      auVar35._24_4_ =
                           (uint)bVar25 * auVar34._24_4_ | (uint)!bVar25 * auVar30._24_4_;
                      bVar25 = SUB81(uVar20 >> 7,0);
                      auVar35._28_4_ =
                           (uint)bVar25 * auVar34._28_4_ | (uint)!bVar25 * auVar30._28_4_;
                      auVar29 = auVar36._0_32_;
                      uVar12 = vcmpps_avx512vl(auVar35,auVar29,1);
                      uVar20 = uVar4;
                      auVar30 = auVar29;
                      auVar34 = auVar35;
                      if (((char)uVar12 == '\0') ||
                         (bVar25 = uVar16 != 8, uVar20 = uVar16, uVar16 = uVar4, auVar30 = auVar35,
                         auVar34 = auVar29, bVar25)) {
                        uVar21 = uVar21 + 1;
                        *puVar22 = uVar20;
                        puVar22 = puVar22 + 1;
                        *pauVar23 = auVar34;
                        pauVar23 = pauVar23 + 1;
                        auVar36 = ZEXT3264(auVar30);
                      }
                      else {
                        auVar36 = ZEXT3264(auVar35);
                      }
                    }
                  }
                } while ((uVar4 != 8) && (bVar25 = uVar19 < 7, uVar19 = uVar19 + 1, bVar25));
                if (1 < uVar21 && uVar16 != 8) {
                  auVar30 = pauVar23[-2];
                  uVar12 = vcmpps_avx512vl(auVar30,pauVar23[-1],1);
                  if ((char)uVar12 != '\0') {
                    pauVar23[-2] = pauVar23[-1];
                    pauVar23[-1] = auVar30;
                    auVar15 = vpermilps_avx(*(undefined1 (*) [16])(puVar22 + -2),0x4e);
                    *(undefined1 (*) [16])(puVar22 + -2) = auVar15;
                  }
                  if (uVar21 != 2) {
                    auVar30 = pauVar23[-3];
                    uVar12 = vcmpps_avx512vl(auVar30,pauVar23[-1],1);
                    if ((char)uVar12 != '\0') {
                      pauVar23[-3] = pauVar23[-1];
                      pauVar23[-1] = auVar30;
                      uVar24 = puVar22[-3];
                      puVar22[-3] = puVar22[-1];
                      puVar22[-1] = uVar24;
                    }
                    auVar30 = pauVar23[-3];
                    uVar12 = vcmpps_avx512vl(auVar30,pauVar23[-2],1);
                    if ((char)uVar12 != '\0') {
                      pauVar23[-3] = pauVar23[-2];
                      pauVar23[-2] = auVar30;
                      auVar15 = vpermilps_avx(*(undefined1 (*) [16])(puVar22 + -3),0x4e);
                      *(undefined1 (*) [16])(puVar22 + -3) = auVar15;
                    }
                  }
                }
                uVar24 = uVar16;
              } while (uVar16 != 8);
            }
            bVar5 = false;
          }
LAB_008870de:
        } while (!bVar5);
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }